

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O2

void __thiscall Pl_Buffer::Pl_Buffer(Pl_Buffer *this,char *identifier,Pipeline *next)

{
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Buffer_002ac258;
  std::make_unique<Pl_Buffer::Members>();
  return;
}

Assistant:

Pl_Buffer::Pl_Buffer(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
}